

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

void __thiscall
wabt::interp::ElemSegment::ElemSegment(ElemSegment *this,Store *store,ElemDesc *desc,Ptr *inst)

{
  pointer pFVar1;
  iterator __position;
  Result RVar2;
  Ref RVar3;
  Instance *this_00;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *__x;
  pointer pFVar4;
  Ptr out_trap;
  Value value;
  Ptr local_108;
  RefPtr<wabt::interp::DefinedFunc> local_e8;
  RefVec *local_d0;
  Ptr *local_c8;
  Ref local_c0;
  anon_union_16_6_113bff37_for_Value_0 local_b8;
  FuncDesc local_a8;
  
  this->desc_ = desc;
  (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.root_index_ = 0;
  local_108.obj_ = (Trap *)0x0;
  local_108.store_ = (Store *)0x0;
  local_d0 = &this->elements_;
  local_c8 = inst;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::reserve
            (local_d0,((long)(desc->elements).
                             super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(desc->elements).
                             super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111);
  pFVar4 = (desc->elements).
           super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (desc->elements).
           super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pFVar4 != pFVar1) {
    __x = &pFVar4->handlers;
    do {
      local_b8.i64_ = 0;
      local_b8._8_8_ = 0;
      RVar3 = RefPtr<wabt::interp::Instance>::ref(local_c8);
      local_a8.type.super_ExternType.kind = (((FuncDesc *)(__x + -4))->type).super_ExternType.kind;
      local_a8.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001880d0;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_a8.type.params,&(((FuncDesc *)(__x + -4))->type).params);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_a8.type.results,
                 (vector<wabt::Type,_std::allocator<wabt::Type>_> *)((long)(__x + -3) + 0x10));
      std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                (&local_a8.locals,
                 (vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_> *)
                 ((long)(__x + -2) + 0x10));
      local_a8.code_offset = *(u32 *)((long)(__x + -1) + 0x10);
      std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
                (&local_a8.handlers,__x);
      local_c0 = RVar3;
      Store::
      Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
                (&local_e8,store,store,&local_c0,&local_a8);
      RVar3 = RefPtr<wabt::interp::DefinedFunc>::ref(&local_e8);
      if (local_e8.obj_ != (DefinedFunc *)0x0) {
        Store::DeleteRoot(local_e8.store_,local_e8.root_index_);
        local_e8.obj_ = (DefinedFunc *)0x0;
        local_e8.store_ = (Store *)0x0;
        local_e8.root_index_ = 0;
      }
      std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
                (&local_a8.handlers);
      if (local_a8.locals.
          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.locals.
                        super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.locals.
                              super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.locals.
                              super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_a8.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001880d0;
      if (local_a8.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.type.results.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.type.results.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.type.results.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      this_00 = (Instance *)
                local_a8.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((Instance *)
          local_a8.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (Instance *)0x0) {
        operator_delete(local_a8.type.params.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.type.params.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.type.params.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      RVar2 = Instance::CallInitFunc(this_00,store,RVar3,(Value *)&local_b8.v128_,&local_108);
      if (RVar2.enum_ == Error) {
        abort();
      }
      local_e8.obj_ = (DefinedFunc *)local_b8.i64_;
      __position._M_current =
           (this->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->elements_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>(local_d0,__position,(Ref *)&local_e8);
      }
      else {
        (__position._M_current)->index = local_b8.i64_;
        (this->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pFVar4 = (pointer)(__x + 1);
      __x = __x + 5;
    } while (pFVar4 != pFVar1);
  }
  if (local_108.obj_ != (Trap *)0x0) {
    Store::DeleteRoot(local_108.store_,local_108.root_index_);
  }
  return;
}

Assistant:

ElemSegment::ElemSegment(Store& store,
                         const ElemDesc* desc,
                         Instance::Ptr& inst)
    : desc_(desc) {
  Trap::Ptr out_trap;
  elements_.reserve(desc->elements.size());
  for (auto&& elem_expr : desc->elements) {
    Value value;
    Ref func_ref = DefinedFunc::New(store, inst.ref(), elem_expr).ref();
    if (Failed(inst->CallInitFunc(store, func_ref, &value, &out_trap))) {
      WABT_UNREACHABLE;  // valid const expression cannot trap
    }
    elements_.push_back(value.Get<Ref>());
  }
}